

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O3

sexp_conflict
sexp_25_25_read_line_stub
          (sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict arg1,sexp_conflict arg2)

{
  sexp_tag_t sVar1;
  int iVar2;
  char *__s;
  long lVar3;
  char *pcVar4;
  sexp_conflict psVar5;
  undefined8 uVar6;
  sexp_conflict res0;
  sexp_conflict local_40;
  sexp_gc_var_t local_38;
  
  local_40 = (sexp_conflict)0x43e;
  if ((((ulong)arg1 & 1) == 0) && ((((ulong)arg1 & 2) != 0 || (arg1->tag != 0xc)))) {
    uVar6 = 2;
    arg2 = arg1;
  }
  else {
    if ((((ulong)arg2 & 3) == 0) && (arg2->tag == 0x10)) {
      if ((arg2->value).type.getters == (sexp)0x0) {
        psVar5 = (sexp_conflict)sexp_xtype_exception(ctx,self,"not a FILE* backed port",arg2);
        return psVar5;
      }
      iVar2 = sexp_maybe_block_port(ctx,arg2,0);
      if (iVar2 != 0) {
        return (sexp_conflict)(((ctx->value).type.setters)->value).context.mark_stack[8].end;
      }
      local_38.var = &local_40;
      local_38.next = (ctx->value).context.saves;
      (ctx->value).context.saves = &local_38;
      if (((ulong)arg1 & 1) == 0) {
        if ((((ulong)arg1 & 2) == 0) && (arg1->tag == 0xc)) {
          sVar1 = arg1->tag;
          __s = (char *)calloc(1,(arg1->value).uvector.length + 1);
          if (sVar1 == 0xc) {
            lVar3 = (long)(arg1->value).flonum_bits[0] * (arg1->value).uvector.length;
            goto LAB_0010335b;
          }
        }
        else {
          __s = (char *)calloc(1,1);
        }
        lVar3 = 0;
      }
      else {
        lVar3 = (long)arg1 >> 1;
        __s = (char *)calloc(1,lVar3 + 1);
      }
LAB_0010335b:
      pcVar4 = fgets(__s,(int)lVar3,(FILE *)(arg2->value).type.getters);
      if (pcVar4 == (char *)0x0) {
        psVar5 = (sexp_conflict)&DAT_0000003e;
      }
      else {
        psVar5 = (sexp_conflict)sexp_c_string(ctx,__s,0xffffffffffffffff);
        local_40 = psVar5;
      }
      free(__s);
      sexp_maybe_unblock_port(ctx,arg2);
      (ctx->value).context.saves = local_38.next;
      return psVar5;
    }
    uVar6 = 0x10;
  }
  psVar5 = (sexp_conflict)sexp_type_exception(ctx,self,uVar6,arg2);
  return psVar5;
}

Assistant:

sexp sexp_25_25_read_line_stub (sexp ctx, sexp self, sexp_sint_t n, sexp arg1, sexp arg2) {
  char *err;
  char *tmp0;
  sexp res;
  sexp_gc_var1(res0);
  if (! sexp_exact_integerp(arg1))
    return sexp_type_exception(ctx, self, SEXP_FIXNUM, arg1);
  if (! sexp_iportp(arg2))
    return sexp_type_exception(ctx, self, SEXP_IPORT, arg2);
  if (!sexp_stream_portp(arg2))
    return sexp_xtype_exception(ctx, self, "not a FILE* backed port", arg2);
  sexp_check_block_port(ctx, arg2, 0);
  sexp_gc_preserve1(ctx, res0);
  tmp0 = (char*) calloc(1, 1 + sexp_uint_value(arg1)*sizeof(tmp0[0]));
  err = fgets(tmp0, sexp_sint_value(arg1), sexp_port_stream(arg2));
  if (!err) {
  res = SEXP_FALSE;
  } else {
  res0 = sexp_c_string(ctx, tmp0, -1);
  res = res0;
  }
  free(tmp0);
  sexp_maybe_unblock_port(ctx, arg2);
  sexp_gc_release1(ctx);
  return res;
}